

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O3

void Am_Drawonable::Process_Event(Am_Time *deadline)

{
  uint *puVar1;
  undefined4 uVar2;
  bool bVar3;
  Am_Wrapper *value;
  Am_Time_Data *pAVar4;
  Am_Time timeout;
  Am_Time now;
  XEvent event_return;
  Am_Time AStack_f8;
  Am_Time local_f0;
  Am_Time local_e8;
  XEvent local_e0;
  
  local_e0.type = 0;
  bVar3 = Am_Time::Zero(deadline);
  if (bVar3) {
    Screen_Manager::Next_Event(&Scrn_Mgr,&local_e0,(timeval *)0x0);
  }
  else {
    Am_Time::Now();
    Am_Time::Am_Time(&AStack_f8);
    bVar3 = Am_Time::operator>(deadline,&local_f0);
    if (bVar3) {
      Am_Time::operator-(&local_e8,deadline);
      Am_Time::operator=(&AStack_f8,&local_e8);
      Am_Time::~Am_Time(&local_e8);
    }
    value = Am_Time::operator_cast_to_Am_Wrapper_(&AStack_f8);
    pAVar4 = Am_Time_Data::Narrow(value);
    Screen_Manager::Next_Event(&Scrn_Mgr,&local_e0,&pAVar4->time);
    puVar1 = &(pAVar4->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar4->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(pAVar4);
    }
    uVar2 = local_e0.type;
    Am_Time::~Am_Time(&AStack_f8);
    Am_Time::~Am_Time(&local_f0);
    if (uVar2 == 0) {
      return;
    }
  }
  Disp_Flush_Extra_Move_Events(&local_e0);
  Am_Handle_Event_Received(&local_e0);
  bVar3 = Am_Time::Is_Past(deadline);
  if (!bVar3) {
    if ((local_e0.type - 4U < 5) || (local_e0.type == 2)) {
LAB_0027b9d9:
      do {
        bVar3 = Screen_Manager::Pending(&Scrn_Mgr,&local_e0);
        if (!bVar3) {
          return;
        }
        if (((uint)local_e0.type < 9) && ((500U >> (local_e0.type & 0x1fU) & 1) != 0)) {
          Screen_Manager::Put_Event_Back(&Scrn_Mgr,&local_e0);
          return;
        }
        Am_Handle_Event_Received(&local_e0);
        bVar3 = Am_Time::Is_Past(deadline);
      } while (!bVar3);
    }
    else {
      do {
        bVar3 = Screen_Manager::Pending(&Scrn_Mgr,&local_e0);
        if ((!bVar3) ||
           ((Am_Handle_Event_Received(&local_e0), (uint)local_e0.type < 9 &&
            ((500U >> (local_e0.type & 0x1fU) & 1) != 0)))) goto LAB_0027b9d9;
        bVar3 = Am_Time::Is_Past(deadline);
      } while (!bVar3);
    }
  }
  return;
}

Assistant:

void
Am_Drawonable::Process_Event(const Am_Time &deadline)
{
  XEvent event_return;

  // jh6p Oct 97 : XWindows calls interfere with network hooks
  // Don't use XPending. It bypasses our network select.
  // Use Screen_Manager::Pending and Screen_Manager::Block.
  // Therefore it is like always having multiple displays, since
  // we didn't use XPending for multiple displays.
  //
  // See also: Process_Event

  event_return.type = 0;

  // If there is no deadline then we will wait forever, if necessary, for
  // the next event. Otherwise we will only wait up till the deadline.
  if (deadline.Zero())
    Scrn_Mgr.Next_Event(&event_return, static_cast<timeval *>(nullptr));
  else {
    // Figure out when we stop processing
    Am_Time now = Am_Time::Now();
    Am_Time timeout;
    if (deadline > now)
      timeout = deadline - now;

    Am_Time_Data *time_data = Am_Time_Data::Narrow(timeout);

    // Only wait as long as the timeout
    Scrn_Mgr.Next_Event(&event_return, &time_data->time);

    time_data->Release();

    // doesn't always return appn event: could time out.
    if (!event_return.type)
      return; // we timed out.
  }

  Disp_Flush_Extra_Move_Events(event_return);
  Am_Handle_Event_Received(event_return);

  if (deadline.Is_Past())
    return;

  // If that was not an input event, then process all the remaining
  // non-input events until we have processed an input event.
  if (!is_input_event(event_return)) {
    while (Scrn_Mgr.Pending(&event_return)) {
      Am_Handle_Event_Received(event_return);

      if (is_input_event(event_return))
        break;

      if (deadline.Is_Past())
        return;
    }
  }

  // Process all remaining non-input events
  while (Scrn_Mgr.Pending(&event_return)) {
    if (is_input_event(event_return)) {
      Scrn_Mgr.Put_Event_Back(event_return);
      return;
    } else
      Am_Handle_Event_Received(event_return);

    if (deadline.Is_Past())
      return;
  }
}